

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadManager.hpp
# Opt level: O0

HANDLE __thiscall
Husky::ThreadManager::CreateThread(ThreadManager *this,PThreadFunc pFunc,void *pPara)

{
  int iVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  __start_routine *in_RSI;
  int nErrorCode;
  pthread_t pt;
  value_type_conflict2 *in_stack_ffffffffffffffd8;
  
  iVar1 = pthread_create((pthread_t *)&stack0xffffffffffffffd8,(pthread_attr_t *)0x0,in_RSI,in_RDX);
  if (iVar1 == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_RDX,in_stack_ffffffffffffffd8);
  }
  return iVar1;
}

Assistant:

HANDLE CreateThread( PThreadFunc pFunc,void *pPara)
            {	
                pthread_t pt;
                int nErrorCode=pthread_create(&pt,NULL,pFunc,pPara);
                if(nErrorCode!=0)
                  return nErrorCode;
                m_vecHandle.push_back(pt);	//加入线程列表 为WaitForMultipleObjects准备	
                return nErrorCode;

            }